

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_window.c
# Opt level: O0

void free_fft_window_data(fft_window_data *data)

{
  fft_window_data *data_local;
  
  if (data->in_fifo != (float *)0x0) {
    (*mixed_free)(data->in_fifo);
  }
  data->in_fifo = (float *)0x0;
  data->out_fifo = (float *)0x0;
  data->fft_workspace = (float *)0x0;
  data->output_accumulator = (float *)0x0;
  data->last_phase = (float *)0x0;
  data->phase_sum = (float *)0x0;
  return;
}

Assistant:

void free_fft_window_data(struct fft_window_data *data){
  if(data->in_fifo)
    mixed_free(data->in_fifo);
  data->in_fifo = 0;
  data->out_fifo = 0;
  data->fft_workspace = 0;
  data->output_accumulator = 0;
  data->last_phase = 0;
  data->phase_sum = 0;
}